

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O2

nbt_status dump_list_contents_ascii(nbt_list *list,buffer *b,size_t ident)

{
  list_head *plVar1;
  nbt_status nVar2;
  
  plVar1 = &list->entry;
  do {
    plVar1 = plVar1->flink;
    if (plVar1 == &list->entry) {
      return NBT_OK;
    }
    nVar2 = __nbt_dump_ascii((nbt_node *)plVar1[-1].flink,b,ident);
  } while (nVar2 == NBT_OK);
  return NBT_ERR;
}

Assistant:

static nbt_status dump_list_contents_ascii(const struct nbt_list* list, struct buffer* b, size_t ident)
{
    const struct list_head* pos;

    list_for_each(pos, &list->entry)
    {
        const struct nbt_list* entry = list_entry(pos, const struct nbt_list, entry);
        nbt_status err;

        if((err = __nbt_dump_ascii(entry->data, b, ident)) != NBT_OK)
            return err;
    }

    return NBT_OK;
}